

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

cmTarget * __thiscall
cmLocalGenerator::AddUtilityCommand
          (cmLocalGenerator *this,string *utilityName,bool excludeFromAll,
          unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc)

{
  cmTarget *target_00;
  bool bVar1;
  pointer pcVar2;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_60 [3];
  cmListFileBacktrace local_48;
  cmTarget *local_38;
  cmTarget *target;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> *cc_local;
  string *psStack_20;
  bool excludeFromAll_local;
  string *utilityName_local;
  cmLocalGenerator *this_local;
  
  target = (cmTarget *)cc;
  cc_local._7_1_ = excludeFromAll;
  psStack_20 = utilityName;
  utilityName_local = (string *)this;
  local_38 = cmMakefile::AddNewUtilityTarget(this->Makefile,utilityName,excludeFromAll);
  cmTarget::SetIsGeneratorProvided(local_38,true);
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  this_00 = &cmCustomCommand::GetCommandLines(pcVar2)->
             super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
  bVar1 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::empty(this_00);
  if (bVar1) {
    pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc)
    ;
    this_01 = cmCustomCommand::GetDepends_abi_cxx11_(pcVar2);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(this_01);
    if (bVar1) {
      return local_38;
    }
  }
  pcVar2 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->(cc);
  cmListFileBacktrace::cmListFileBacktrace(&local_48,&this->DirectoryBacktrace);
  cmCustomCommand::SetBacktrace(pcVar2,&local_48);
  cmListFileBacktrace::~cmListFileBacktrace(&local_48);
  target_00 = local_38;
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr(local_60,cc);
  detail::AddUtilityCommand(this,Generator,target_00,local_60);
  std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr(local_60);
  return local_38;
}

Assistant:

cmTarget* cmLocalGenerator::AddUtilityCommand(
  const std::string& utilityName, bool excludeFromAll,
  std::unique_ptr<cmCustomCommand> cc)
{
  cmTarget* target =
    this->Makefile->AddNewUtilityTarget(utilityName, excludeFromAll);
  target->SetIsGeneratorProvided(true);

  if (cc->GetCommandLines().empty() && cc->GetDepends().empty()) {
    return target;
  }

  cc->SetBacktrace(this->DirectoryBacktrace);
  detail::AddUtilityCommand(*this, cmCommandOrigin::Generator, target,
                            std::move(cc));

  return target;
}